

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_attachments(HL1MDLLoader *this)

{
  pointer *pppaVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  Header_HL1 *pHVar5;
  iterator __position;
  size_type sVar6;
  aiNode *paVar7;
  aiNode **ppaVar8;
  aiMetadata *paVar9;
  aiString *paVar10;
  aiMetadataEntry *paVar11;
  undefined8 *puVar12;
  uint *puVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  aiNode *attachments_node;
  string local_80;
  aiNode *local_60;
  undefined4 local_54;
  HL1MDLLoader *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pHVar5 = this->header_;
  if (pHVar5->numattachments != 0) {
    iVar3 = pHVar5->attachmentindex;
    paVar7 = (aiNode *)operator_new(0x478);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"<MDL_attachments>","");
    aiNode::aiNode(paVar7,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    __position._M_current =
         (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60 = paVar7;
    if (__position._M_current ==
        (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                ((vector<aiNode*,std::allocator<aiNode*>> *)&this->rootnode_children_,__position,
                 &local_60);
    }
    else {
      *__position._M_current = paVar7;
      pppaVar1 = &(this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    paVar7 = local_60;
    uVar4 = this->header_->numattachments;
    local_60->mNumChildren = uVar4;
    ppaVar8 = (aiNode **)operator_new__((ulong)uVar4 << 3);
    paVar7->mChildren = ppaVar8;
    if (0 < this->header_->numattachments) {
      pcVar16 = (pHVar5->super_HalfLifeMDLBaseHeader).ident + iVar3;
      lVar14 = 0;
      local_50 = this;
      do {
        paVar7 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar7);
        local_60->mChildren[lVar14] = paVar7;
        paVar7->mParent = local_60;
        paVar9 = (aiMetadata *)operator_new(0x18);
        paVar9->mNumProperties = 2;
        paVar10 = (aiString *)operator_new__(0x808);
        lVar15 = 5;
        do {
          pcVar2 = paVar10->data + lVar15 + -9;
          pcVar2[0] = '\0';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          paVar10->data[lVar15 + -5] = '\0';
          memset(paVar10->data + lVar15 + -4,0x1b,0x3ff);
          lVar15 = lVar15 + 0x404;
        } while (lVar15 != 0x80d);
        paVar9->mKeys = paVar10;
        paVar11 = (aiMetadataEntry *)operator_new__(0x20);
        *(undefined8 *)paVar11 = 0;
        paVar11->mData = (void *)0x0;
        *(undefined8 *)(paVar11 + 1) = 0;
        paVar11[1].mData = (void *)0x0;
        paVar9->mValues = paVar11;
        paVar7->mMetaData = paVar9;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Position","");
        sVar6 = local_80._M_string_length;
        if ((paVar9->mNumProperties != 0) && (local_80._M_string_length != 0)) {
          local_48 = *(undefined8 *)(pcVar16 + 0x28);
          uStack_40 = 0;
          local_54 = *(undefined4 *)(pcVar16 + 0x30);
          if (local_80._M_string_length < 0x400) {
            paVar10 = paVar9->mKeys;
            paVar10->length = (ai_uint32)local_80._M_string_length;
            memcpy(paVar10->data,local_80._M_dataplus._M_p,local_80._M_string_length);
            paVar10->data[sVar6] = '\0';
          }
          paVar9->mValues->mType = AI_AIVECTOR3D;
          puVar12 = (undefined8 *)operator_new(0xc);
          *puVar12 = local_48;
          *(undefined4 *)(puVar12 + 1) = local_54;
          paVar9->mValues->mData = puVar12;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        paVar9 = paVar7->mMetaData;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Bone","");
        sVar6 = local_80._M_string_length;
        if ((1 < paVar9->mNumProperties) && (local_80._M_string_length != 0)) {
          paVar7 = (local_50->temp_bones_).
                   super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
                   ._M_impl.super__Vector_impl_data._M_start[*(int *)(pcVar16 + 0x24)].node;
          if (local_80._M_string_length < 0x400) {
            paVar10 = paVar9->mKeys;
            paVar10[1].length = (ai_uint32)local_80._M_string_length;
            memcpy(paVar10[1].data,local_80._M_dataplus._M_p,local_80._M_string_length);
            paVar10[1].data[sVar6] = '\0';
          }
          paVar9->mValues[1].mType = AI_AISTRING;
          puVar13 = (uint *)operator_new(0x404);
          uVar4 = (paVar7->mName).length;
          if (0x3fe < uVar4) {
            uVar4 = 0x3ff;
          }
          *puVar13 = uVar4;
          memcpy(puVar13 + 1,(paVar7->mName).data,(ulong)uVar4);
          *(undefined1 *)((long)puVar13 + (ulong)uVar4 + 4) = 0;
          paVar9->mValues[1].mData = puVar13;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        lVar14 = lVar14 + 1;
        pcVar16 = pcVar16 + 0x58;
      } while (lVar14 < local_50->header_->numattachments);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_attachments() {
    if (!header_->numattachments)
        return;

    const Attachment_HL1 *pattach = (const Attachment_HL1 *)((uint8_t *)header_ + header_->attachmentindex);

    aiNode *attachments_node = new aiNode(AI_MDL_HL1_NODE_ATTACHMENTS);
    rootnode_children_.push_back(attachments_node);
    attachments_node->mNumChildren = static_cast<unsigned int>(header_->numattachments);
    attachments_node->mChildren = new aiNode *[attachments_node->mNumChildren];

    for (int i = 0; i < header_->numattachments; ++i, ++pattach) {
        aiNode *attachment_node = attachments_node->mChildren[i] = new aiNode();
        attachment_node->mParent = attachments_node;
        attachment_node->mMetaData = aiMetadata::Alloc(2);
        attachment_node->mMetaData->Set(0, "Position", aiVector3D(pattach->org[0], pattach->org[1], pattach->org[2]));
        // Reference the bone by name. This allows us to search a particular
        // bone by name using aiNode(s).
        attachment_node->mMetaData->Set(1, "Bone", temp_bones_[pattach->bone].node->mName);
    }
}